

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

bool __thiscall sf::VertexBuffer::create(VertexBuffer *this,size_t vertexCount)

{
  GLuint GVar1;
  bool bVar2;
  ostream *poVar3;
  GLenum GVar4;
  TransientContextLock contextLock;
  TransientContextLock local_21;
  
  bVar2 = isAvailable();
  if (bVar2) {
    GlResource::TransientContextLock::TransientContextLock(&local_21);
    if (this->m_buffer == 0) {
      (*sf_glad_glGenBuffersARB)(1,&this->m_buffer);
    }
    GVar1 = this->m_buffer;
    bVar2 = GVar1 != 0;
    if (GVar1 == 0) {
      poVar3 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Could not create vertex buffer, generation failed",0x31);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else {
      (*sf_glad_glBindBufferARB)(0x8892,GVar1);
      GVar4 = 0x88e4;
      if (this->m_usage != Static) {
        GVar4 = (uint)(this->m_usage == Dynamic) * 8 + 0x88e0;
      }
      (*sf_glad_glBufferDataARB)(0x8892,vertexCount * 0x14,(void *)0x0,GVar4);
      (*sf_glad_glBindBufferARB)(0x8892,0);
      this->m_size = vertexCount;
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_21);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool VertexBuffer::create(std::size_t vertexCount)
{
    if (!isAvailable())
        return false;

    TransientContextLock contextLock;

    if (!m_buffer)
        glCheck(GLEXT_glGenBuffers(1, &m_buffer));

    if (!m_buffer)
    {
        err() << "Could not create vertex buffer, generation failed" << std::endl;
        return false;
    }

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));
    glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, static_cast<GLsizeiptrARB>(sizeof(Vertex) * vertexCount), 0, VertexBufferImpl::usageToGlEnum(m_usage)));
    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    m_size = vertexCount;

    return true;
}